

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# prog.cc
# Opt level: O2

bool duckdb_re2::IsMatch(Prog *prog,Inst *ip)

{
  uint uVar1;
  
  while( true ) {
    uVar1 = ip->out_opcode_ & 7;
    if ((0x48U >> uVar1 & 1) == 0) break;
    ip = (Inst *)((long)&((prog->inst_).ptr_._M_t.
                          super___uniq_ptr_impl<duckdb_re2::Prog::Inst,_duckdb_re2::PODArray<duckdb_re2::Prog::Inst>::Deleter>
                          ._M_t.
                          super__Tuple_impl<0UL,_duckdb_re2::Prog::Inst_*,_duckdb_re2::PODArray<duckdb_re2::Prog::Inst>::Deleter>
                          .super__Head_base<0UL,_duckdb_re2::Prog::Inst_*,_false>._M_head_impl)->
                         out_opcode_ + (ulong)(ip->out_opcode_ >> 1 & 0xfffffff8));
  }
  if ((0x97U >> uVar1 & 1) != 0) {
    return false;
  }
  return true;
}

Assistant:

static bool IsMatch(Prog* prog, Prog::Inst* ip) {
  for (;;) {
    switch (ip->opcode()) {
      default:
        LOG(DFATAL) << "Unexpected opcode in IsMatch: " << ip->opcode();
        return false;

      case kInstAlt:
      case kInstAltMatch:
      case kInstByteRange:
      case kInstFail:
      case kInstEmptyWidth:
        return false;

      case kInstCapture:
      case kInstNop:
        ip = prog->inst(ip->out());
        break;

      case kInstMatch:
        return true;
    }
  }
}